

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integrate.c
# Opt level: O0

void xc_rdqagse(integr_fn *f,void *ex,double *a,double *b,double *epsabs,double *epsrel,int *limit,
               double *result,double *abserr,int *neval,int *ier,double *alist__,double *blist,
               double *rlist,double *elist,int *iord,int *last)

{
  double dVar1;
  long lVar2;
  double *in_RCX;
  double *in_RDX;
  double *in_R8;
  double *in_R9;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double *abserr_00;
  int *in_stack_00000008;
  double *in_stack_00000010;
  double *in_stack_00000018;
  int *in_stack_00000020;
  int *in_stack_00000028;
  double *in_stack_00000030;
  double *in_stack_00000038;
  double *in_stack_00000040;
  double *in_stack_00000048;
  int *in_stack_00000050;
  double small;
  double ertest;
  double erlarg;
  double correc;
  double errsum;
  double errmax;
  double erlast;
  double errbnd;
  double erro12;
  double error2;
  double error1;
  double reseps;
  double resabs;
  double uflow;
  double oflow;
  double defab2;
  double defab1;
  double defabs;
  double b2;
  double b1;
  double a2;
  double a1;
  double epmach;
  double dres;
  double area12;
  double area2;
  double area1;
  double area;
  double abseps;
  double rlist2 [52];
  double res3la [3];
  int maxerr;
  int jupbnd;
  int numrl2;
  int id;
  int iroff3;
  int iroff2;
  int iroff1;
  int nrmax;
  int ktmin;
  int ierro;
  int nres;
  int ksgn;
  int k;
  int extrap;
  int noext;
  double local_350;
  int *local_348;
  double local_338;
  int *local_330;
  double local_328;
  double local_310;
  int *local_308;
  double *nres_00;
  double *res3la_00;
  double *result_00;
  double *epstab;
  double local_2c8;
  double local_2c0;
  double local_2b8;
  double local_2b0;
  double local_298;
  double local_290;
  double local_288;
  double local_248;
  double local_240;
  double local_238;
  double local_230;
  double local_228 [20];
  double *in_stack_fffffffffffffe78;
  double *in_stack_fffffffffffffe80;
  double *in_stack_fffffffffffffe88;
  double *in_stack_fffffffffffffe90;
  void *in_stack_fffffffffffffe98;
  integr_fn *in_stack_fffffffffffffea0;
  double *in_stack_fffffffffffffeb0;
  double *in_stack_fffffffffffffeb8;
  int local_6c;
  int local_68;
  int local_64;
  int local_60;
  int local_5c;
  int local_58;
  int local_54;
  int local_50;
  int local_4c;
  int local_48;
  undefined4 local_44;
  int local_40;
  int local_3c;
  int local_38;
  int local_34;
  double *local_30;
  double *local_28;
  double *local_20;
  double *local_18;
  
  res3la_00 = (double *)0x0;
  nres_00 = (double *)0x0;
  local_308 = (int *)0x0;
  local_310 = 0.0;
  *in_stack_00000028 = 0;
  *in_stack_00000020 = 0;
  *(undefined4 *)small = 0;
  *in_stack_00000010 = 0.0;
  *in_stack_00000018 = 0.0;
  *in_stack_00000030 = *in_RDX;
  *in_stack_00000038 = *in_RCX;
  *in_stack_00000040 = 0.0;
  *in_stack_00000048 = 0.0;
  if ((*in_R8 <= 0.0) && (*in_R9 < 1.1102230246251565e-14)) {
    *in_stack_00000028 = 6;
    return;
  }
  local_48 = 0;
  local_30 = in_R9;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  rdqk21(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,in_stack_fffffffffffffe90,
         in_stack_fffffffffffffe88,in_stack_fffffffffffffe80,in_stack_fffffffffffffe78,
         in_stack_fffffffffffffeb0,in_stack_fffffffffffffeb8);
  dVar3 = ABS(*in_stack_00000010);
  if (*local_30 * dVar3 <= *local_28) {
    local_328 = *local_28;
  }
  else {
    local_328 = *local_30 * dVar3;
  }
  *(undefined4 *)small = 1;
  *in_stack_00000040 = *in_stack_00000010;
  *in_stack_00000048 = *in_stack_00000018;
  *in_stack_00000050 = 1;
  if ((*in_stack_00000018 <= local_288 * 2.220446049250313e-14) && (local_328 < *in_stack_00000018))
  {
    *in_stack_00000028 = 2;
  }
  if (*in_stack_00000008 == 1) {
    *in_stack_00000028 = 1;
  }
  if (*in_stack_00000028 != 0) goto LAB_00c2a5e9;
  if (*in_stack_00000018 <= local_328) {
    if ((*in_stack_00000018 != local_2b0) || (NAN(*in_stack_00000018) || NAN(local_2b0)))
    goto LAB_00c2a5e9;
  }
  if ((*in_stack_00000018 == 0.0) && (!NAN(*in_stack_00000018))) goto LAB_00c2a5e9;
  local_228[0] = *in_stack_00000010;
  result_00 = (double *)*in_stack_00000018;
  local_6c = 1;
  local_238 = *in_stack_00000010;
  abserr_00 = (double *)*in_stack_00000018;
  *in_stack_00000018 = 1.79769313486232e+308;
  local_50 = 1;
  local_44 = 0;
  local_64 = 2;
  local_4c = 0;
  local_38 = 0;
  local_34 = 0;
  local_54 = 0;
  local_58 = 0;
  local_5c = 0;
  local_40 = -1;
  if (local_288 * 0.9999999999999889 <= dVar3) {
    local_40 = 1;
  }
  *(undefined4 *)small = 2;
  while (*(int *)small <= *in_stack_00000008) {
    dVar3 = in_stack_00000030[(long)local_6c + -1];
    dVar4 = (in_stack_00000030[(long)local_6c + -1] + in_stack_00000038[(long)local_6c + -1]) * 0.5;
    dVar1 = in_stack_00000038[(long)local_6c + -1];
    epstab = result_00;
    rdqk21(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,in_stack_fffffffffffffe90,
           in_stack_fffffffffffffe88,in_stack_fffffffffffffe80,in_stack_fffffffffffffe78,
           in_stack_fffffffffffffeb0,in_stack_fffffffffffffeb8);
    rdqk21(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,in_stack_fffffffffffffe90,
           in_stack_fffffffffffffe88,in_stack_fffffffffffffe80,in_stack_fffffffffffffe78,
           in_stack_fffffffffffffeb0,in_stack_fffffffffffffeb8);
    dVar5 = local_240 + local_248;
    dVar6 = local_2c0 + local_2c8;
    abserr_00 = (double *)(((double)abserr_00 + dVar6) - (double)result_00);
    local_238 = (local_238 + dVar5) - in_stack_00000040[(long)local_6c + -1];
    if ((local_290 != local_2c0) || (NAN(local_290) || NAN(local_2c0))) {
      if ((local_298 != local_2c8) || (NAN(local_298) || NAN(local_2c8))) {
        if ((ABS(in_stack_00000040[(long)local_6c + -1] - dVar5) <= ABS(dVar5) * 1e-05) &&
           ((double)result_00 * 0.99 <= dVar6)) {
          if (local_38 == 0) {
            local_54 = local_54 + 1;
          }
          else {
            local_58 = local_58 + 1;
          }
        }
        if ((10 < *(int *)small) && ((double)result_00 < dVar6)) {
          local_5c = local_5c + 1;
        }
      }
    }
    in_stack_00000040[(long)local_6c + -1] = local_240;
    in_stack_00000040[(long)*(int *)small + -1] = local_248;
    if (*local_30 * ABS(local_238) <= *local_28) {
      local_330 = (int *)*local_28;
    }
    else {
      local_330 = (int *)(*local_30 * ABS(local_238));
    }
    if ((9 < local_54 + local_58) || (0x13 < local_5c)) {
      *in_stack_00000028 = 2;
    }
    if (4 < local_58) {
      local_48 = 3;
    }
    if (*(int *)small == *in_stack_00000008) {
      *in_stack_00000028 = 1;
    }
    local_338 = dVar3;
    if (ABS(dVar3) < ABS(dVar1)) {
      local_338 = dVar1;
    }
    local_338 = ABS(local_338);
    if (local_338 <= (ABS(dVar4) + 2.2250738585072014e-305) * 1.0000000000000222) {
      *in_stack_00000028 = 4;
    }
    if (local_2c8 <= local_2c0) {
      in_stack_00000030[(long)*(int *)small + -1] = dVar4;
      in_stack_00000038[(long)local_6c + -1] = dVar4;
      in_stack_00000038[(long)*(int *)small + -1] = dVar1;
      in_stack_00000048[(long)local_6c + -1] = local_2c0;
      in_stack_00000048[(long)*(int *)small + -1] = local_2c8;
    }
    else {
      in_stack_00000030[(long)local_6c + -1] = dVar4;
      in_stack_00000030[(long)*(int *)small + -1] = dVar3;
      in_stack_00000038[(long)*(int *)small + -1] = dVar4;
      in_stack_00000040[(long)local_6c + -1] = local_248;
      in_stack_00000040[(long)*(int *)small + -1] = local_240;
      in_stack_00000048[(long)local_6c + -1] = local_2c8;
      in_stack_00000048[(long)*(int *)small + -1] = local_2c0;
    }
    rdqpsrt(in_stack_00000008,(int *)small,&local_6c,(double *)&stack0xfffffffffffffd18,
            in_stack_00000048,in_stack_00000050,&local_50);
    if ((double)abserr_00 <= (double)local_330) goto LAB_00c2a563;
    if (*in_stack_00000028 != 0) break;
    if (*(int *)small == 2) {
      local_310 = ABS(*local_20 - *local_18) * 0.375;
      local_308 = local_330;
      nres_00 = abserr_00;
      local_228[1] = local_238;
    }
    else if (local_34 == 0) {
      nres_00 = (double *)((double)nres_00 - (double)epstab);
      if (local_310 < ABS(dVar4 - dVar3)) {
        nres_00 = (double *)(dVar6 + (double)nres_00);
      }
      if (local_38 == 0) {
        if (local_310 <
            ABS(in_stack_00000038[(long)local_6c + -1] - in_stack_00000030[(long)local_6c + -1]))
        goto LAB_00c2a310;
        local_38 = 1;
        local_50 = 2;
      }
      if ((local_48 != 3) && ((double)local_308 < (double)nres_00)) {
        local_60 = local_50;
        local_68 = *(int *)small;
        if (*in_stack_00000008 / 2 + 2 < *(int *)small) {
          local_68 = (*in_stack_00000008 + 3) - *(int *)small;
        }
        for (local_3c = local_50; local_3c <= local_68; local_3c = local_3c + 1) {
          local_6c = in_stack_00000050[(long)local_50 + -1];
          result_00 = (double *)in_stack_00000048[(long)local_6c + -1];
          if (local_310 <
              ABS(in_stack_00000038[(long)local_6c + -1] - in_stack_00000030[(long)local_6c + -1]))
          goto LAB_00c2a310;
          local_50 = local_50 + 1;
        }
      }
      lVar2 = (long)local_64;
      local_64 = local_64 + 1;
      local_228[lVar2] = local_238;
      rdqelg(local_330,epstab,result_00,abserr_00,res3la_00,(int *)nres_00);
      local_4c = local_4c + 1;
      if ((5 < local_4c) && (*in_stack_00000018 < (double)abserr_00 * 0.001)) {
        *in_stack_00000028 = 5;
      }
      if (local_230 < *in_stack_00000018) {
        local_4c = 0;
        *in_stack_00000018 = local_230;
        *in_stack_00000010 = local_2b8;
        if (*local_30 * ABS(local_2b8) <= *local_28) {
          local_348 = (int *)*local_28;
        }
        else {
          local_348 = (int *)(*local_30 * ABS(local_2b8));
        }
        local_308 = local_348;
        res3la_00 = nres_00;
        if (*in_stack_00000018 <= (double)local_348) break;
      }
      if (local_64 == 1) {
        local_34 = 1;
      }
      if (*in_stack_00000028 == 5) break;
      local_6c = *in_stack_00000050;
      result_00 = (double *)in_stack_00000048[(long)local_6c + -1];
      local_50 = 1;
      local_38 = 0;
      local_310 = local_310 * 0.5;
      nres_00 = abserr_00;
    }
LAB_00c2a310:
    *(int *)small = *(int *)small + 1;
  }
  if ((*in_stack_00000018 == 1.79769313486232e+308) && (!NAN(*in_stack_00000018)))
  goto LAB_00c2a563;
  if (*in_stack_00000028 + local_48 == 0) {
LAB_00c2a453:
    if (local_40 == -1) {
      local_350 = local_238;
      if (ABS(local_238) <= ABS(*in_stack_00000010)) {
        local_350 = *in_stack_00000010;
      }
      local_350 = ABS(local_350);
      if (local_350 <= local_288 * 0.01) goto LAB_00c2a5da;
    }
    if (((*in_stack_00000010 / local_238 < 0.01) || (100.0 < *in_stack_00000010 / local_238)) ||
       (ABS(local_238) < (double)abserr_00)) {
      *in_stack_00000028 = 5;
    }
  }
  else {
    if (local_48 == 3) {
      *in_stack_00000018 = (double)res3la_00 + *in_stack_00000018;
    }
    if (*in_stack_00000028 == 0) {
      *in_stack_00000028 = 3;
    }
    if (((*in_stack_00000010 == 0.0) && (!NAN(*in_stack_00000010))) ||
       ((local_238 == 0.0 && (!NAN(local_238))))) {
      if ((double)abserr_00 < *in_stack_00000018) goto LAB_00c2a563;
      if ((local_238 != 0.0) || (NAN(local_238))) goto LAB_00c2a453;
    }
    else {
      if (*in_stack_00000018 / ABS(*in_stack_00000010) <= (double)abserr_00 / ABS(local_238))
      goto LAB_00c2a453;
LAB_00c2a563:
      *in_stack_00000010 = 0.0;
      for (local_3c = 1; local_3c <= *(int *)small; local_3c = local_3c + 1) {
        *in_stack_00000010 = in_stack_00000040[(long)local_3c + -1] + *in_stack_00000010;
      }
      *in_stack_00000018 = (double)abserr_00;
    }
  }
LAB_00c2a5da:
  if (*in_stack_00000028 < 3) {
    return;
  }
LAB_00c2a5e9:
  *in_stack_00000020 = *(int *)small * 0x2a + -0x15;
  return;
}

Assistant:

GPU_FUNCTION void xc_rdqagse(integr_fn f, void *ex, double *a, double *b,
	     double *epsabs, double *epsrel, int *limit, double *result,
	     double *abserr, int *neval, int *ier, double *alist__,
	     double *blist, double *rlist, double *elist, int *iord, int *last)
{
  /* Local variables */
  int noext, extrap;
  int k,ksgn, nres;
  int ierro;
  int ktmin, nrmax;
  int iroff1, iroff2, iroff3;
  int id;
  int numrl2;
  int jupbnd;
  int maxerr;
  double res3la[3];
  double rlist2[52];
  double abseps, area, area1, area2, area12, dres, epmach;
  double a1, a2, b1, b2, defabs, defab1, defab2, oflow, uflow, resabs, reseps;
  double error1, error2, erro12, errbnd, erlast, errmax, errsum;

  double correc = 0.0, erlarg = 0.0, ertest = 0.0, small = 0.0;
  /*
 ***begin prologue  dqagse
 ***date written   800101   (yymmdd)
 ***revision date  830518   (yymmdd)
 ***category no.  h2a1a1
 ***keywords  automatic integrator, general-purpose,
              (end point) singularities, extrapolation,
              globally adaptive
 ***author  piessens,robert,appl. math. & progr. div. - k.u.leuven
            de doncker,elise,appl. math. & progr. div. - k.u.leuven
 ***purpose  the routine calculates an approximation result to a given
             definite integral i = integral of f over (a,b),
             hopefully satisfying following claim for accuracy
             abs(i-result) <= max(epsabs,epsrel*abs(i)).
 ***description

       computation of a definite integral
       standard fortran subroutine
       double precision version

       parameters
        on entry
           f      - double precision
                    function subprogram defining the integrand
                    function f(x). the actual name for f needs to be
                    declared e x t e r n a l in the driver program.

           a      - double precision
                    lower limit of integration

           b      - double precision
                    upper limit of integration

           epsabs - double precision
                    absolute accuracy requested
           epsrel - double precision
                    relative accuracy requested
                    if  epsabs <= 0
                    and epsrel < max(50*rel.mach.acc.,0.5d-28),
                    the routine will end with ier = 6.

           limit  - int
                    gives an upperbound on the number of subintervals
                    in the partition of (a,b)

        on return
           result - double precision
                    approximation to the integral

           abserr - double precision
                    estimate of the modulus of the absolute error,
                    which should equal or exceed abs(i-result)

           neval  - int
                    number of integrand evaluations

           ier    - int
                    ier = 0 normal and reliable termination of the
                            routine. it is assumed that the requested
                            accuracy has been achieved.
                    ier > 0 abnormal termination of the routine
                            the estimates for integral and error are
                            less reliable. it is assumed that the
                            requested accuracy has not been achieved.
           error messages
                        = 1 maximum number of subdivisions allowed
                            has been achieved. one can allow more sub-
                            divisions by increasing the value of limit
                            (and taking the according dimension
                            adjustments into account). however, if
                            this yields no improvement it is advised
                            to analyze the integrand in order to
                            determine the integration difficulties. if
                            the position of a local difficulty can be
                            determined (e.g. singularity,
                            discontinuity within the interval) one
                            will probably gain from splitting up the
                            interval at this point and calling the
                            integrator on the subranges. if possible,
                            an appropriate special-purpose integrator
                            should be used, which is designed for
                            handling the type of difficulty involved.
                        = 2 the occurrence of roundoff error is detec-
                            ted, which prevents the requested
                            tolerance from being achieved.
                            the error may be under-estimated.
                        = 3 extremely bad integrand behaviour
                            occurs at some points of the integration
                            interval.
                        = 4 the algorithm does not converge.
                            roundoff error is detected in the
                            extrapolation table.
                            it is presumed that the requested
                            tolerance cannot be achieved, and that the
                            returned result is the best which can be
                            obtained.
                        = 5 the integral is probably divergent, or
                            slowly convergent. it must be noted that
                            divergence can occur with any other value
                            of ier.
                        = 6 the input is invalid, because
                            epsabs <= 0 and
                            epsrel < max(50*rel.mach.acc.,0.5d-28).
                            result, abserr, neval, last, rlist(1),
                            iord(1) and elist(1) are set to zero.
                            alist(1) and blist(1) are set to a and b
                            respectively.

           alist  - double precision
                    vector of dimension at least limit, the first
                     last  elements of which are the left end points
                    of the subintervals in the partition of the
                    given integration range (a,b)

           blist  - double precision
                    vector of dimension at least limit, the first
                     last  elements of which are the right end points
                    of the subintervals in the partition of the given
                    integration range (a,b)

           rlist  - double precision
                    vector of dimension at least limit, the first
                     last  elements of which are the integral
                    approximations on the subintervals

           elist  - double precision
                    vector of dimension at least limit, the first
                     last  elements of which are the moduli of the
                    absolute error estimates on the subintervals

           iord   - int
                    vector of dimension at least limit, the first k
                    elements of which are pointers to the
                    error estimates over the subintervals,
                    such that elist(iord(1)), ..., elist(iord(k))
                    form a decreasing sequence, with k = last
                    if last <= (limit/2+2), and k = limit+1-last
                    otherwise

           last   - int
                    number of subintervals actually produced in the
                    subdivision process

 ***references  (none)
 ***routines called  dqelg,dqk21,dqpsrt
 ***end prologue  dqagse



           the dimension of rlist2 is determined by the value of
           limexp in subroutine dqelg (rlist2 should be of dimension
           (limexp+2) at least).

           list of major variables
           -----------------------

          alist     - list of left end points of all subintervals
                      considered up to now
          blist     - list of right end points of all subintervals
                      considered up to now
          rlist(i)  - approximation to the integral over
                      (alist(i),blist(i))
          rlist2    - array of dimension at least limexp+2 containing
                      the part of the epsilon table which is still
                      needed for further computations
          elist(i)  - error estimate applying to rlist(i)
          maxerr    - pointer to the interval with largest error
                      estimate
          errmax    - elist(maxerr)
          erlast    - error on the interval currently subdivided
                      (before that subdivision has taken place)
          area      - sum of the integrals over the subintervals
          errsum    - sum of the errors over the subintervals
          errbnd    - requested accuracy max(epsabs,epsrel*
                      abs(result))
          *****1    - variable for the left interval
          *****2    - variable for the right interval
          last      - index for subdivision
          nres      - number of calls to the extrapolation routine
          numrl2    - number of elements currently in rlist2. if an
                      appropriate approximation to the compounded
                      integral has been obtained it is put in
                      rlist2(numrl2) after numrl2 has been increased
                      by one.
          small     - length of the smallest interval considered up
                      to now, multiplied by 1.5
          erlarg    - sum of the errors over the intervals larger
                      than the smallest interval considered up to now
          extrap    - logical variable denoting that the routine is
                      attempting to perform extrapolation i.e. before
                      subdividing the smallest interval we try to
                      decrease the value of erlarg.
          noext     - logical variable denoting that extrapolation
                      is no longer allowed (true value)

           machine dependent constants
           ---------------------------

          epmach is the largest relative spacing.
          uflow is the smallest positive magnitude.
          oflow is the largest positive magnitude. */

  /* ***first executable statement  dqagse */
  /* Parameter adjustments */
  --iord;
  --elist;
  --rlist;
  --blist;
  --alist__;

  /* Function Body */
  epmach = DBL_EPSILON;

  /*            test on validity of parameters */
  /*            ------------------------------ */
  *ier = 0;
  *neval = 0;
  *last = 0;
  *result = 0.;
  *abserr = 0.;
  alist__[1] = *a;
  blist[1] = *b;
  rlist[1] = 0.;
  elist[1] = 0.;
  if (*epsabs <= 0. && *epsrel < m_max(epmach * 50., 5e-29)) {
    *ier = 6;
    return;
  }

  /*           first approximation to the integral */
  /*           ----------------------------------- */

  uflow = DBL_MIN;
  oflow = DBL_MAX;
  ierro = 0;
  rdqk21(f, ex, a, b, result, abserr, &defabs, &resabs);

  /*           test on accuracy. */

  dres = fabs(*result);
  errbnd = m_max(*epsabs, *epsrel * dres);
  *last = 1;
  rlist[1] = *result;
  elist[1] = *abserr;
  iord[1] = 1;
  if (*abserr <= epmach * 100. * defabs && *abserr > errbnd)
    *ier = 2;
  if (*limit == 1)
    *ier = 1;
  if (*ier != 0 || (*abserr <= errbnd && *abserr != resabs)
      || *abserr == 0.) goto L140;

  /*           initialization */
  /*           -------------- */

  rlist2[0] = *result;
  errmax = *abserr;
  maxerr = 1;
  area = *result;
  errsum = *abserr;
  *abserr = oflow;
  nrmax = 1;
  nres = 0;
  numrl2 = 2;
  ktmin = 0;
  extrap = FALSE;
  noext = FALSE;
  iroff1 = 0;
  iroff2 = 0;
  iroff3 = 0;
  ksgn = -1;
  if (dres >= (1. - epmach * 50.) * defabs) {
    ksgn = 1;
  }

  /*           main do-loop */
  /*           ------------ */

  for (*last = 2; *last <= *limit; ++(*last)) {

    /*           bisect the subinterval with the nrmax-th largest error estimate. */

    a1 = alist__[maxerr];
    b1 = (alist__[maxerr] + blist[maxerr]) * .5;
    a2 = b1;
    b2 = blist[maxerr];
    erlast = errmax;
    rdqk21(f, ex, &a1, &b1, &area1, &error1, &resabs, &defab1);
    rdqk21(f, ex, &a2, &b2, &area2, &error2, &resabs, &defab2);

    /*           improve previous approximations to integral
		 and error and test for accuracy. */

    area12 = area1 + area2;
    erro12 = error1 + error2;
    errsum = errsum + erro12 - errmax;
    area = area + area12 - rlist[maxerr];
    if (defab1 == error1 || defab2 == error2) {
      goto L15;
    }
    if (fabs(rlist[maxerr] - area12) > fabs(area12) * 1e-5 ||
	erro12 < errmax * .99) {
      goto L10;
    }
    if (extrap) {
      ++iroff2;
    }
    if (! extrap) {
      ++iroff1;
    }
  L10:
    if (*last > 10 && erro12 > errmax) {
      ++iroff3;
    }
  L15:
    rlist[maxerr] = area1;
    rlist[*last] = area2;
    errbnd = m_max(*epsabs, *epsrel * fabs(area));

    /*           test for roundoff error and eventually set error flag. */

    if (iroff1 + iroff2 >= 10 || iroff3 >= 20)
      *ier = 2;
    if (iroff2 >= 5)
      ierro = 3;

    /* set error flag in the case that the number of subintervals equals limit. */
    if (*last == *limit)
      *ier = 1;

    /*           set error flag in the case of bad integrand behaviour
		 at a point of the integration range. */

    if (m_max(fabs(a1), fabs(b2)) <=
	(epmach * 100. + 1.) * (fabs(a2) + uflow * 1e3)) {
      *ier = 4;
    }

    /*           append the newly-created intervals to the list. */

    if (error2 > error1) {
      alist__[maxerr] = a2;
      alist__[*last] = a1;
      blist[*last] = b1;
      rlist[maxerr] = area2;
      rlist[*last] = area1;
      elist[maxerr] = error2;
      elist[*last] = error1;
    } else {
      alist__[*last] = a2;
      blist[maxerr] = b1;
      blist[*last] = b2;
      elist[maxerr] = error1;
      elist[*last] = error2;
    }

    /*           call subroutine dqpsrt to maintain the descending ordering
		 in the list of error estimates and select the subinterval
		 with nrmax-th largest error estimate (to be bisected next). */

    /*L30:*/
    rdqpsrt(limit, last, &maxerr, &errmax, &elist[1], &iord[1], &nrmax);

    if (errsum <= errbnd)   goto L115;/* ***jump out of do-loop */
    if (*ier != 0)	    goto L100;/* ***jump out of do-loop */

    if (*last == 2)	    goto L80;
    if (noext)		    goto L90;

    erlarg -= erlast;
    if (fabs(b1 - a1) > small) {
      erlarg += erro12;
    }
    if (extrap) {
      goto L40;
    }

    /*           test whether the interval to be bisected next is the
		 smallest interval. */

    if (fabs(blist[maxerr] - alist__[maxerr]) > small) {
      goto L90;
    }
    extrap = TRUE;
    nrmax = 2;
  L40:
    if (ierro == 3 || erlarg <= ertest) {
      goto L60;
    }

    /*           the smallest interval has the largest error.
		 before bisecting decrease the sum of the errors over the
		 larger intervals (erlarg) and perform extrapolation. */

    id = nrmax;
    jupbnd = *last;
    if (*last > *limit / 2 + 2) {
      jupbnd = *limit + 3 - *last;
    }
    for (k = id; k <= jupbnd; ++k) {
      maxerr = iord[nrmax];
      errmax = elist[maxerr];
      if (fabs(blist[maxerr] - alist__[maxerr]) > small) {
	goto L90;/* ***jump out of do-loop */
      }
      ++nrmax;
      /* L50: */
    }

    /*           perform extrapolation. */

  L60:
    ++numrl2;
    rlist2[numrl2 - 1] = area;
    rdqelg(&numrl2, rlist2, &reseps, &abseps, res3la, &nres);
    ++ktmin;
    if (ktmin > 5 && *abserr < errsum * .001) {
      *ier = 5;
    }
    if (abseps >= *abserr) {
      goto L70;
    }
    ktmin = 0;
    *abserr = abseps;
    *result = reseps;
    correc = erlarg;
    ertest = m_max(*epsabs, *epsrel * fabs(reseps));
    if (*abserr <= ertest) {
      goto L100;/* ***jump out of do-loop */
    }

    /*           prepare bisection of the smallest interval. */

  L70:
    if (numrl2 == 1) {
      noext = TRUE;
    }
    if (*ier == 5) {
      goto L100;
    }
    maxerr = iord[1];
    errmax = elist[maxerr];
    nrmax = 1;
    extrap = FALSE;
    small *= .5;
    erlarg = errsum;
    goto L90;
  L80:
    small = fabs(*b - *a) * .375;
    erlarg = errsum;
    ertest = errbnd;
    rlist2[1] = area;
  L90:
    ;
  }


 L100:/*		set final result and error estimate. */
      /*		------------------------------------ */
  if (*abserr == oflow) 	goto L115;
  if (*ier + ierro == 0) 	goto L110;
  if (ierro == 3)
    *abserr += correc;
  if (*ier == 0)
    *ier = 3;
  if (*result != 0. && area != 0.) goto L105;
  if (*abserr > errsum) 	goto L115;
  if (area == 0.) 		goto L130;
  goto L110;

 L105:
  if (*abserr / fabs(*result) > errsum / fabs(area)) {
    goto L115;
  }

 L110:/*		test on divergence. */
  if (ksgn == -1 && m_max(fabs(*result), fabs(area)) <= defabs * .01) {
    goto L130;
  }
  if (.01 > *result / area || *result / area > 100. || errsum > fabs(area)) {
    *ier = 5;
  }
  goto L130;

 L115:/*		compute global integral sum. */
  *result = 0.;
  for (k = 1; k <= *last; ++k)
    *result += rlist[k];
  *abserr = errsum;
 L130:
  if (*ier > 2)
  L140:
    *neval = *last * 42 - 21;

  return;
}